

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecXor.c
# Opt level: O2

Acec_Box_t *
Acec_FindBox(Gia_Man_t *p,Vec_Int_t *vAdds,Vec_Wec_t *vAddBoxes,Vec_Wec_t *vXorLeaves,
            Vec_Int_t *vXorRoots)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Vec_Bit_t *p_00;
  Vec_Bit_t *p_01;
  Vec_Bit_t *p_02;
  Acec_Box_t *pAVar6;
  Vec_Wec_t *p_03;
  Vec_Wec_t *p_04;
  Vec_Int_t *pVVar7;
  Vec_Int_t *pVVar8;
  int Entry;
  int Entry_00;
  int Entry_01;
  int Entry_02;
  int Entry_03;
  int Entry_04;
  int iVar9;
  int iVar10;
  
  iVar10 = vAddBoxes->nSize;
  p_00 = Vec_BitStart(vAdds->nSize / 6);
  p_01 = Vec_BitStart(p->nObjs);
  p_02 = Vec_BitStart(p->nObjs);
  pAVar6 = (Acec_Box_t *)calloc(1,0x30);
  pAVar6->pGia = p;
  pAVar6->vAdds = vAddBoxes;
  p_03 = Vec_WecStart(iVar10);
  pAVar6->vLeafLits = p_03;
  p_04 = Vec_WecStart(iVar10);
  pAVar6->vRootLits = p_04;
  iVar10 = vAddBoxes->nSize;
  if (iVar10 != vXorLeaves->nSize) {
    __assert_fail("Vec_WecSize(vAddBoxes) == Vec_WecSize(vXorLeaves)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecXor.c"
                  ,0x131,
                  "Acec_Box_t *Acec_FindBox(Gia_Man_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *)"
                 );
  }
  if (iVar10 != vXorRoots->nSize) {
    __assert_fail("Vec_WecSize(vAddBoxes) == Vec_IntSize(vXorRoots)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecXor.c"
                  ,0x132,
                  "Acec_Box_t *Acec_FindBox(Gia_Man_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *)"
                 );
  }
  for (iVar9 = 0; iVar9 < iVar10; iVar9 = iVar9 + 1) {
    pVVar7 = Vec_WecEntry(vAddBoxes,iVar9);
    for (iVar10 = 0; iVar10 < pVVar7->nSize; iVar10 = iVar10 + 1) {
      iVar1 = Vec_IntEntry(pVVar7,iVar10);
      iVar1 = iVar1 * 6;
      iVar2 = Vec_IntEntry(vAdds,iVar1);
      Vec_BitWriteEntry(p_01,iVar2,Entry);
      iVar2 = Vec_IntEntry(vAdds,iVar1 + 1);
      Vec_BitWriteEntry(p_01,iVar2,Entry_00);
      iVar2 = Vec_IntEntry(vAdds,iVar1 + 2);
      Vec_BitWriteEntry(p_01,iVar2,Entry_01);
      iVar2 = Vec_IntEntry(vAdds,iVar1 + 3);
      Vec_BitWriteEntry(p_02,iVar2,Entry_02);
      iVar1 = Vec_IntEntry(vAdds,iVar1 + 4);
      Vec_BitWriteEntry(p_02,iVar1,Entry_03);
    }
    iVar10 = vAddBoxes->nSize;
  }
  for (iVar9 = 0; iVar9 < iVar10; iVar9 = iVar9 + 1) {
    pVVar7 = Vec_WecEntry(vAddBoxes,iVar9);
    Vec_IntSort(pVVar7,0);
    iVar10 = vAddBoxes->nSize;
  }
  pVVar7 = Acec_TreeCarryMap(p,vAdds,vAddBoxes);
  iVar10 = vAddBoxes->nSize;
  while (0 < iVar10) {
    iVar10 = iVar10 + -1;
    pVVar8 = Vec_WecEntry(vAddBoxes,iVar10);
    for (iVar9 = 0; iVar9 < pVVar8->nSize; iVar9 = iVar9 + 1) {
      iVar2 = Vec_IntEntry(pVVar8,iVar9);
      iVar1 = iVar2 * 6 + 4;
      iVar3 = Vec_IntEntry(vAdds,iVar1);
      iVar3 = Vec_BitEntry(p_01,iVar3);
      if (iVar3 == 0) {
        iVar1 = Vec_IntEntry(vAdds,iVar1);
        iVar2 = Vec_IntEntry(vAdds,iVar2 * 6 + 2);
        Acec_TreePhases_rec(p,vAdds,pVVar7,iVar1,(uint)(iVar2 != 0),p_00);
      }
    }
  }
  Acec_TreeVerifyPhases(p,vAdds,vAddBoxes);
  Acec_TreeVerifyPhases2(p,vAdds,vAddBoxes);
  Vec_BitFree(p_00);
  Vec_IntFree(pVVar7);
  Vec_BitWriteEntry(p_02,0,Entry_04);
  for (iVar10 = 0; iVar10 < vAddBoxes->nSize; iVar10 = iVar10 + 1) {
    pVVar7 = Vec_WecEntry(vAddBoxes,iVar10);
    for (iVar9 = 0; iVar9 < pVVar7->nSize; iVar9 = iVar9 + 1) {
      iVar1 = Vec_IntEntry(pVVar7,iVar9);
      iVar3 = iVar1 * 6;
      for (iVar2 = 0; iVar2 != 3; iVar2 = iVar2 + 1) {
        iVar4 = Vec_IntEntry(vAdds,iVar3 + iVar2);
        iVar4 = Vec_BitEntry(p_02,iVar4);
        if (iVar4 == 0) {
          iVar4 = Vec_IntEntry(vAdds,iVar3 + iVar2);
          iVar5 = Acec_SignBit2(vAdds,iVar1,iVar2);
          iVar4 = Abc_Var2Lit(iVar4,iVar5);
          Vec_WecPush(p_03,iVar10,iVar4);
        }
      }
      for (iVar2 = 3; iVar2 != 5; iVar2 = iVar2 + 1) {
        iVar4 = Vec_IntEntry(vAdds,iVar3 + iVar2);
        iVar4 = Vec_BitEntry(p_01,iVar4);
        if (iVar4 == 0) {
          iVar4 = Vec_IntEntry(vAdds,iVar3 + iVar2);
          iVar5 = Acec_SignBit2(vAdds,iVar1,iVar2);
          iVar4 = Abc_Var2Lit(iVar4,iVar5);
          Vec_WecPush(p_04,(uint)(iVar2 == 4) + iVar10,iVar4);
        }
      }
      iVar2 = Vec_IntEntry(vAdds,iVar3 + 2);
      if ((iVar2 == 0) && (iVar1 = Acec_SignBit2(vAdds,iVar1,2), iVar1 != 0)) {
        Vec_WecPush(p_03,iVar10,1);
      }
    }
  }
  Vec_BitFree(p_01);
  Vec_BitFree(p_02);
  pVVar7 = Vec_WecEntry(p_03,p_03->nSize + -1);
  pVVar8 = Vec_WecEntry(vXorLeaves,vXorLeaves->nSize + -1);
  if ((pVVar7->nSize == 0) && (iVar10 = pVVar8->nSize, 0 < iVar10)) {
    for (iVar9 = 0; iVar9 < iVar10; iVar9 = iVar9 + 1) {
      iVar10 = Vec_IntEntry(pVVar8,iVar9);
      iVar10 = Abc_Var2Lit(iVar10,0);
      Vec_IntPush(pVVar7,iVar10);
      iVar10 = pVVar8->nSize;
    }
  }
  pVVar7 = Vec_WecEntry(p_04,p_04->nSize + -1);
  if ((long)vXorRoots->nSize < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
  }
  iVar10 = Abc_Var2Lit(vXorRoots->pArray[(long)vXorRoots->nSize + -1],0);
  Vec_IntGrow(pVVar7,1);
  *pVVar7->pArray = iVar10;
  pVVar7->nSize = 1;
  for (iVar10 = 0; iVar10 < p_03->nSize; iVar10 = iVar10 + 1) {
    pVVar7 = Vec_WecEntry(p_03,iVar10);
    Vec_IntSort(pVVar7,0);
  }
  for (iVar10 = 0; iVar10 < p_04->nSize; iVar10 = iVar10 + 1) {
    pVVar7 = Vec_WecEntry(p_04,iVar10);
    Vec_IntSort(pVVar7,1);
  }
  return pAVar6;
}

Assistant:

Acec_Box_t * Acec_FindBox( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Wec_t * vAddBoxes, Vec_Wec_t * vXorLeaves, Vec_Int_t * vXorRoots )
{
    extern Vec_Int_t * Acec_TreeCarryMap( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Wec_t * vBoxes );
    extern void Acec_TreePhases_rec( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Int_t * vMap, int Node, int fPhase, Vec_Bit_t * vVisit );
    extern void Acec_TreeVerifyPhases( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Wec_t * vBoxes );
    extern void Acec_TreeVerifyPhases2( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Wec_t * vBoxes );

    int MaxRank = Vec_WecSize( vAddBoxes );
    Vec_Bit_t * vVisit  = Vec_BitStart( Vec_IntSize(vAdds)/6 );
    Vec_Bit_t * vIsLeaf = Vec_BitStart( Gia_ManObjNum(p) );
    Vec_Bit_t * vIsRoot = Vec_BitStart( Gia_ManObjNum(p) );
    Vec_Int_t * vLevel, * vLevel2, * vMap;
    int i, j, k, Box, Node;

    Acec_Box_t * pBox = ABC_CALLOC( Acec_Box_t, 1 );
    pBox->pGia        = p;
    pBox->vAdds       = vAddBoxes; // Vec_WecDup( vAddBoxes );
    pBox->vLeafLits   = Vec_WecStart( MaxRank + 0 );
    pBox->vRootLits   = Vec_WecStart( MaxRank + 0 );

    assert( Vec_WecSize(vAddBoxes) == Vec_WecSize(vXorLeaves) );
    assert( Vec_WecSize(vAddBoxes) == Vec_IntSize(vXorRoots) );

    // collect boxes; mark inputs/outputs
    Vec_WecForEachLevel( pBox->vAdds, vLevel, i )
    Vec_IntForEachEntry( vLevel, Box, k )
    {
        Vec_BitWriteEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+0), 1 );
        Vec_BitWriteEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+1), 1 );
        Vec_BitWriteEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+2), 1 );
        Vec_BitWriteEntry( vIsRoot, Vec_IntEntry(vAdds, 6*Box+3), 1 );
        Vec_BitWriteEntry( vIsRoot, Vec_IntEntry(vAdds, 6*Box+4), 1 );
    }
    // sort each level
    Vec_WecForEachLevel( pBox->vAdds, vLevel, i )
        Vec_IntSort( vLevel, 0 );

    // set phases starting from roots
    vMap = Acec_TreeCarryMap( p, vAdds, pBox->vAdds );
    Vec_WecForEachLevelReverse( pBox->vAdds, vLevel, i )
        Vec_IntForEachEntry( vLevel, Box, k )
            if ( !Vec_BitEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+4) ) )
            {
                //printf( "Pushing phase of output %d of box %d\n", Vec_IntEntry(vAdds, 6*Box+4), Box );
                Acec_TreePhases_rec( p, vAdds, vMap, Vec_IntEntry(vAdds, 6*Box+4), Vec_IntEntry(vAdds, 6*Box+2) != 0, vVisit );
            }
    Acec_TreeVerifyPhases( p, vAdds, pBox->vAdds );
    Acec_TreeVerifyPhases2( p, vAdds, pBox->vAdds );
    Vec_BitFree( vVisit );
    Vec_IntFree( vMap );

    // collect inputs/outputs
    Vec_BitWriteEntry( vIsRoot, 0, 1 );
    Vec_WecForEachLevel( pBox->vAdds, vLevel, i )
        Vec_IntForEachEntry( vLevel, Box, j )
        {
            for ( k = 0; k < 3; k++ )
                if ( !Vec_BitEntry( vIsRoot, Vec_IntEntry(vAdds, 6*Box+k) ) )
                    Vec_WecPush( pBox->vLeafLits, i, Abc_Var2Lit(Vec_IntEntry(vAdds, 6*Box+k), Acec_SignBit2(vAdds, Box, k)) );
            for ( k = 3; k < 5; k++ )
                if ( !Vec_BitEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+k) ) )
                    Vec_WecPush( pBox->vRootLits, k == 4 ? i + 1 : i, Abc_Var2Lit(Vec_IntEntry(vAdds, 6*Box+k), Acec_SignBit2(vAdds, Box, k)) );
            if ( Vec_IntEntry(vAdds, 6*Box+2) == 0 && Acec_SignBit2(vAdds, Box, 2) )
                Vec_WecPush( pBox->vLeafLits, i, 1 );
        }
    Vec_BitFree( vIsLeaf );
    Vec_BitFree( vIsRoot );

    // collect last bit
    vLevel  = Vec_WecEntry( pBox->vLeafLits, Vec_WecSize(pBox->vLeafLits)-1 );
    vLevel2 = Vec_WecEntry( vXorLeaves, Vec_WecSize(vXorLeaves)-1 );
    if ( Vec_IntSize(vLevel) == 0 && Vec_IntSize(vLevel2) > 0 )
    {
        Vec_IntForEachEntry( vLevel2, Node, k )
            Vec_IntPush( vLevel, Abc_Var2Lit(Node, 0) );
    }
    vLevel  = Vec_WecEntry( pBox->vRootLits, Vec_WecSize(pBox->vRootLits)-1 );
    Vec_IntFill( vLevel, 1, Abc_Var2Lit(Vec_IntEntryLast(vXorRoots), 0) );

    // sort each level
    Vec_WecForEachLevel( pBox->vLeafLits, vLevel, i )
        Vec_IntSort( vLevel, 0 );
    Vec_WecForEachLevel( pBox->vRootLits, vLevel, i )
        Vec_IntSort( vLevel, 1 );

    //Acec_CheckBoothPPs( p, pBox->vLeafLits );
    return pBox;
}